

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::enum_to_stem_string::unitWidth(UNumberUnitWidth value,UnicodeString *sb)

{
  switch(value) {
  case UNUM_UNIT_WIDTH_NARROW:
    UnicodeString::doAppend(sb,L"unit-width-narrow",0,-1);
    break;
  case UNUM_UNIT_WIDTH_SHORT:
    UnicodeString::doAppend(sb,L"unit-width-short",0,-1);
    break;
  case UNUM_UNIT_WIDTH_FULL_NAME:
    UnicodeString::doAppend(sb,L"unit-width-full-name",0,-1);
    break;
  case UNUM_UNIT_WIDTH_ISO_CODE:
    UnicodeString::doAppend(sb,L"unit-width-iso-code",0,-1);
    break;
  case UNUM_UNIT_WIDTH_HIDDEN:
    UnicodeString::doAppend(sb,L"unit-width-hidden",0,-1);
  }
  return;
}

Assistant:

void enum_to_stem_string::unitWidth(UNumberUnitWidth value, UnicodeString& sb) {
    switch (value) {
        case UNUM_UNIT_WIDTH_NARROW:
            sb.append(u"unit-width-narrow", -1);
            break;
        case UNUM_UNIT_WIDTH_SHORT:
            sb.append(u"unit-width-short", -1);
            break;
        case UNUM_UNIT_WIDTH_FULL_NAME:
            sb.append(u"unit-width-full-name", -1);
            break;
        case UNUM_UNIT_WIDTH_ISO_CODE:
            sb.append(u"unit-width-iso-code", -1);
            break;
        case UNUM_UNIT_WIDTH_HIDDEN:
            sb.append(u"unit-width-hidden", -1);
            break;
        default:
            U_ASSERT(false);
    }
}